

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::AssignNewResultIds
          (LoopUnrollerUtilsImpl *this,BasicBlock *basic_block)

{
  DefUseManager *this_00;
  bool bVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  mapped_type *pmVar4;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *this_01;
  mapped_type *ppIVar5;
  uint32_t local_70;
  uint32_t local_6c;
  reference pIStack_68;
  uint32_t old_id;
  Instruction *line;
  iterator __end3;
  iterator __begin3;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *__range3;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  BasicBlock *__range2;
  DefUseManager *pDStack_20;
  uint32_t new_label_id;
  DefUseManager *def_use_mgr;
  BasicBlock *basic_block_local;
  LoopUnrollerUtilsImpl *this_local;
  
  def_use_mgr = (DefUseManager *)basic_block;
  basic_block_local = (BasicBlock *)this;
  pDStack_20 = IRContext::get_def_use_mgr(this->context_);
  uVar2 = IRContext::TakeNextId(this->context_);
  __range2._4_4_ = uVar2;
  pIVar3 = BasicBlock::GetLabelInst((BasicBlock *)def_use_mgr);
  __range2._0_4_ = opt::Instruction::result_id(pIVar3);
  pmVar4 = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&(this->state_).new_inst,(key_type *)&__range2);
  *pmVar4 = uVar2;
  pIVar3 = BasicBlock::GetLabelInst((BasicBlock *)def_use_mgr);
  opt::Instruction::SetResultId(pIVar3,__range2._4_4_);
  this_00 = pDStack_20;
  pIVar3 = BasicBlock::GetLabelInst((BasicBlock *)def_use_mgr);
  analysis::DefUseManager::AnalyzeInstDefUse(this_00,pIVar3);
  BasicBlock::begin((BasicBlock *)&__end2);
  BasicBlock::end((BasicBlock *)&inst);
  while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&inst), bVar1) {
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    this_01 = opt::Instruction::dbg_line_insts(pIVar3);
    __end3 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
             begin(this_01);
    line = (Instruction *)
           std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::end
                     (this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
                                       *)&line), bVar1) {
      pIStack_68 = __gnu_cxx::
                   __normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
                   ::operator*(&__end3);
      analysis::DefUseManager::AnalyzeInstDefUse(pDStack_20,pIStack_68);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
      ::operator++(&__end3);
    }
    local_6c = opt::Instruction::result_id(pIVar3);
    if (local_6c != 0) {
      uVar2 = IRContext::TakeNextId(this->context_);
      opt::Instruction::SetResultId(pIVar3,uVar2);
      analysis::DefUseManager::AnalyzeInstDef(pDStack_20,pIVar3);
      uVar2 = opt::Instruction::result_id(pIVar3);
      pmVar4 = std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&(this->state_).new_inst,&local_6c);
      *pmVar4 = uVar2;
      uVar2 = opt::Instruction::result_id(this->loop_induction_variable_);
      if (uVar2 == local_6c) {
        (this->state_).new_phi = pIVar3;
      }
      local_70 = opt::Instruction::result_id(pIVar3);
      ppIVar5 = std::
                unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                ::operator[](&(this->state_).ids_to_new_inst,&local_70);
      *ppIVar5 = pIVar3;
    }
    InstructionList::iterator::operator++(&__end2);
  }
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::AssignNewResultIds(BasicBlock* basic_block) {
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  // Label instructions aren't covered by normal traversal of the
  // instructions.
  // TODO(1841): Handle id overflow.
  uint32_t new_label_id = context_->TakeNextId();

  // Assign a new id to the label.
  state_.new_inst[basic_block->GetLabelInst()->result_id()] = new_label_id;
  basic_block->GetLabelInst()->SetResultId(new_label_id);
  def_use_mgr->AnalyzeInstDefUse(basic_block->GetLabelInst());

  for (Instruction& inst : *basic_block) {
    // Do def/use analysis on new lines
    for (auto& line : inst.dbg_line_insts())
      def_use_mgr->AnalyzeInstDefUse(&line);

    uint32_t old_id = inst.result_id();

    // Ignore stores etc.
    if (old_id == 0) {
      continue;
    }

    // Give the instruction a new id.
    // TODO(1841): Handle id overflow.
    inst.SetResultId(context_->TakeNextId());
    def_use_mgr->AnalyzeInstDef(&inst);

    // Save the mapping of old_id -> new_id.
    state_.new_inst[old_id] = inst.result_id();
    // Check if this instruction is the induction variable.
    if (loop_induction_variable_->result_id() == old_id) {
      // Save a pointer to the new copy of it.
      state_.new_phi = &inst;
    }
    state_.ids_to_new_inst[inst.result_id()] = &inst;
  }
}